

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

int compare_files(char *fn,char *fn2)

{
  int iVar1;
  uint __fd;
  uint __fd_00;
  int iVar2;
  ostream *poVar3;
  ulong __n;
  ulong uVar4;
  size_t b;
  char *pcVar5;
  __off_t _Var6;
  stat sb2;
  stat sb1;
  uint8_t buf2 [512];
  uint8_t buf1 [512];
  
  iVar1 = stat(fn,(stat *)&sb1);
  if ((iVar1 == 0) && (iVar1 = stat(fn2,(stat *)&sb2), iVar1 == 0)) {
    if (sb1.st_size == sb2.st_size) {
      iVar1 = 0;
      __fd = open(fn,0);
      __fd_00 = open(fn2,0);
      if (-1 < (int)(__fd_00 | __fd)) {
        iVar1 = 0;
        for (_Var6 = sb1.st_size; _Var6 != 0; _Var6 = _Var6 - __n) {
          __n = read(__fd,buf1,0x200);
          uVar4 = read(__fd_00,buf2,0x200);
          if ((long)(uVar4 | __n) < 0) {
            pcVar5 = "Unable to read from files ";
LAB_0010e0b2:
            poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
            poVar3 = std::ostream::_M_insert<long>((long)poVar3);
            poVar3 = std::operator<<(poVar3,", ");
            poVar3 = std::ostream::_M_insert<long>((long)poVar3);
            goto LAB_0010e0dc;
          }
          if (__n != uVar4) {
            pcVar5 = "Mismatch in read amounts ";
            goto LAB_0010e0b2;
          }
          if ((0 < (long)__n) && (iVar2 = bcmp(buf1,buf2,__n), iVar2 != 0)) {
            uVar4 = 0;
            iVar1 = -1;
            goto LAB_0010e104;
          }
        }
      }
LAB_0010e0e8:
      close(__fd);
      close(__fd_00);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"File sizes do not match: \'");
      poVar3 = std::operator<<(poVar3,fn);
      poVar3 = std::operator<<(poVar3,"\' ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3," \'");
      poVar3 = std::operator<<(poVar3,fn2);
      poVar3 = std::operator<<(poVar3,"\' ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar1 = 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to stat \'");
    poVar3 = std::operator<<(poVar3,fn);
    poVar3 = std::operator<<(poVar3,"\' and \'");
    poVar3 = std::operator<<(poVar3,fn2);
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar1 = -1;
  }
  return iVar1;
LAB_0010e104:
  if (__n != uVar4) {
    if (buf1[uVar4] == buf2[uVar4]) goto code_r0x0010e119;
    poVar3 = std::operator<<((ostream *)&std::cerr,"Files \'");
    poVar3 = std::operator<<(poVar3,fn);
    poVar3 = std::operator<<(poVar3,"\' and \'");
    poVar3 = std::operator<<(poVar3,fn2);
    poVar3 = std::operator<<(poVar3,"\' differ in chunk starting at ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
LAB_0010e0dc:
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar1 = -1;
  }
  goto LAB_0010e0e8;
code_r0x0010e119:
  uVar4 = uVar4 + 1;
  goto LAB_0010e104;
}

Assistant:

static int compare_files (const char *fn, const char *fn2)
{
    struct stat sb1, sb2;
    if ( 0 == stat (fn, &sb1) && 0 == stat (fn2, &sb2))
    {
        if (sb1.st_size != sb2.st_size)
        {
            std::cerr << "File sizes do not match: '" << fn << "' " << sb1.st_size << " '" << fn2 << "' " << sb2.st_size << std::endl;
            return 1;
        }
        int fd1, fd2;
        int ret = 0;
        fd1 = open (fn, O_RDONLY);
        fd2 = open (fn2, O_RDONLY);
        if (fd1 >= 0 && fd2 >= 0)
        {
            uint8_t buf1[512], buf2[512];
            size_t toRead = sb1.st_size;
            size_t chunkReq = sizeof(buf1);
            size_t offset = 0;
            while (toRead > 0)
            {
                ssize_t nr1 = read (fd1, buf1, chunkReq);
                ssize_t nr2 = read (fd2, buf2, chunkReq);
                if (nr1 < 0 || nr2 < 0)
                {
                    std::cerr << "Unable to read from files " << nr1 << ", " << nr2 << std::endl;
                    ret = -1;
                    break;
                }
                if (nr1 != nr2)
                {
                    std::cerr << "Mismatch in read amounts " << nr1 << ", " << nr2 << std::endl;
                    ret = -1;
                    break;
                }
                if (nr1 > 0)
                {
                    if (memcmp (buf1, buf2, nr1) != 0)
                    {
                        for ( size_t b = 0; b < nr1; ++b )
                        {
                            if (buf1[b] != buf2[b])
                            {
                                std::cerr << "Files '" << fn << "' and '" << fn2 << "' differ in chunk starting at " << offset + b << std::endl;
                                break;
                            }
                        }
                        ret = -1;
                        break;
                    }
                }
                offset += nr1;
                toRead -= nr1;
            }
        }
        close (fd1);
        close (fd2);
        return ret;
    }
    else
    {
        std::cerr << "Unable to stat '" << fn << "' and '" << fn2 << "'" << std::endl;
    }
    return -1;
}